

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringstream.h
# Opt level: O2

ParseLocation * __thiscall
embree::StringStream::location(ParseLocation *__return_storage_ptr__,StringStream *this)

{
  ParseLocation *pPVar1;
  
  pPVar1 = Stream<int>::loc((this->cin).ptr);
  ParseLocation::ParseLocation(__return_storage_ptr__,pPVar1);
  return __return_storage_ptr__;
}

Assistant:

ParseLocation location() { return cin->loc(); }